

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O2

CURLcode __thiscall
curlpp::internal::CurlHandle::executeSslCtxFunctor(CurlHandle *this,void *ssl_ctx)

{
  FunctorImpl<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *pFVar1;
  CURLcode CVar2;
  CallbackException<curlpp::LogicError> *this_00;
  LogicError LStack_28;
  
  pFVar1 = (this->mSslFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *)0x0) {
    this_00 = (CallbackException<curlpp::LogicError> *)operator_new(0x20);
    LogicError::LogicError(&LStack_28,"Null write functor");
    CallbackException<curlpp::LogicError>::CallbackException(this_00,&LStack_28);
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = (CallbackExceptionBase *)this_00;
    LogicError::~LogicError(&LStack_28);
    CVar2 = CURLE_ABORTED_BY_CALLBACK;
  }
  else {
    CVar2 = (*(code *)**(undefined8 **)pFVar1)();
  }
  return CVar2;
}

Assistant:

CURLcode 
CurlHandle::executeSslCtxFunctor(void * ssl_ctx)
{
	if (!mSslFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mSslFunctor(ssl_ctx);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}